

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
vk::wsi::getSwapchainImages
          (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
           *__return_storage_ptr__,DeviceInterface *vkd,VkDevice device,VkSwapchainKHR swapchain)

{
  VkDevice pVVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  VkResult VVar4;
  ulong __n;
  reference pvVar5;
  allocator<vk::Handle<(vk::HandleType)9>_> local_3a;
  undefined1 local_39;
  deUint64 local_38;
  uint local_2c;
  VkDevice pVStack_28;
  deUint32 numImages;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkSwapchainKHR swapchain_local;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *images;
  
  local_2c = 0;
  local_38 = swapchain.m_internal;
  pVStack_28 = device;
  device_local = (VkDevice)vkd;
  vkd_local = (DeviceInterface *)swapchain.m_internal;
  swapchain_local.m_internal = (deUint64)__return_storage_ptr__;
  VVar4 = (*vkd->_vptr_DeviceInterface[0x7a])(vkd,device,swapchain.m_internal,&local_2c,0);
  checkResult(VVar4,"vkd.getSwapchainImagesKHR(device, swapchain, &numImages, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,0x13f);
  if (local_2c == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(__return_storage_ptr__);
  }
  else {
    local_39 = 0;
    __n = (ulong)local_2c;
    std::allocator<vk::Handle<(vk::HandleType)9>_>::allocator(&local_3a);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(__return_storage_ptr__,__n,&local_3a);
    std::allocator<vk::Handle<(vk::HandleType)9>_>::~allocator(&local_3a);
    pDVar3 = vkd_local;
    pVVar2 = device_local;
    pVVar1 = pVStack_28;
    pvVar5 = std::
             vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
             ::operator[](__return_storage_ptr__,0);
    VVar4 = (**(code **)(*(long *)pVVar2 + 0x3d0))(pVVar2,pVVar1,pDVar3,&local_2c,pvVar5);
    checkResult(VVar4,"vkd.getSwapchainImagesKHR(device, swapchain, &numImages, &images[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x145);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkImage> getSwapchainImages (const DeviceInterface&			vkd,
										 VkDevice						device,
										 VkSwapchainKHR					swapchain)
{
	deUint32	numImages	= 0;

	VK_CHECK(vkd.getSwapchainImagesKHR(device, swapchain, &numImages, DE_NULL));

	if (numImages > 0)
	{
		std::vector<VkImage>	images	(numImages);

		VK_CHECK(vkd.getSwapchainImagesKHR(device, swapchain, &numImages, &images[0]));

		return images;
	}
	else
		return std::vector<VkImage>();
}